

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_buildInfo.cpp
# Opt level: O2

char * amrex::buildInfoGetGitHash(int i)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (i == 2) {
    pcVar2 = "22.09";
  }
  pcVar1 = "v1.0.1-37-g21a5a7f25a03";
  if (i != 1) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* buildInfoGetGitHash(int i) {

  //static const char HASH1[] = "${GIT[1]}";
  static const char HASH1[] = "v1.0.1-37-g21a5a7f25a03";
  static const char HASH2[] = "22.09";
  static const char EMPT[] = "";

  switch(i)
  {
    case 1: return HASH1;
    case 2: return HASH2;
    default: return EMPT;
  }
}